

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O2

void anon_unknown.dwarf_18ac8a::RunWycheproofTestCase(FileTest *t,EVP_AEAD *aead)

{
  pointer *this;
  uint8_t *puVar1;
  AssertionResult *pAVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  evp_aead_ctx_st_state *this_00;
  char *pcVar6;
  char *in_R9;
  pointer puVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper local_3e0;
  Bytes local_3d8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__9;
  size_t out_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  WycheproofResult result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ct_and_tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  string tag_size_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ct;
  ScopedEVP_AEAD_CTX ctx;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ctx,"ivSize",(allocator<char> *)&tag_size_str);
  FileTest::HasInstruction(t,(string *)&ctx);
  std::__cxx11::string::~string((string *)&ctx);
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ctx,"aad",(allocator<char> *)&result);
  bVar3 = FileTest::GetBytes(t,&aad,(string *)&ctx);
  tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
  tag_size_str._M_string_length = 0;
  std::__cxx11::string::~string((string *)&ctx);
  if ((char)tag_size_str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&result);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ctx,(internal *)&tag_size_str,
               (AssertionResult *)"t->GetBytes(&aad, \"aad\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x389,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&ctx);
    if (result._0_8_ != 0) {
      (**(code **)(*(long *)result._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tag_size_str._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ctx,"ct",(allocator<char> *)&result);
    bVar3 = FileTest::GetBytes(t,&ct,(string *)&ctx);
    tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
    tag_size_str._M_string_length = 0;
    std::__cxx11::string::~string((string *)&ctx);
    if ((char)tag_size_str._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&result);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ctx,(internal *)&tag_size_str,
                 (AssertionResult *)"t->GetBytes(&ct, \"ct\")","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x38a,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
      std::__cxx11::string::~string((string *)&ctx);
      if (result._0_8_ != 0) {
        (**(code **)(*(long *)result._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tag_size_str._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ctx,"iv",(allocator<char> *)&result);
      bVar3 = FileTest::GetBytes(t,&iv,(string *)&ctx);
      tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
      tag_size_str._M_string_length = 0;
      std::__cxx11::string::~string((string *)&ctx);
      if ((char)tag_size_str._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&result);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&ctx,(internal *)&tag_size_str,
                   (AssertionResult *)"t->GetBytes(&iv, \"iv\")","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x38b,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&result);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
        std::__cxx11::string::~string((string *)&ctx);
        if (result._0_8_ != 0) {
          (**(code **)(*(long *)result._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&tag_size_str._M_string_length);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ctx,"key",(allocator<char> *)&result);
        bVar3 = FileTest::GetBytes(t,&key,(string *)&ctx);
        tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
        tag_size_str._M_string_length = 0;
        std::__cxx11::string::~string((string *)&ctx);
        if ((char)tag_size_str._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&result);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ctx,(internal *)&tag_size_str,
                     (AssertionResult *)"t->GetBytes(&key, \"key\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x38c,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__7,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
          std::__cxx11::string::~string((string *)&ctx);
          if (result._0_8_ != 0) {
            (**(code **)(*(long *)result._0_8_ + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&tag_size_str._M_string_length);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ctx,"msg",(allocator<char> *)&result);
          bVar3 = FileTest::GetBytes(t,&msg,(string *)&ctx);
          tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
          tag_size_str._M_string_length = 0;
          std::__cxx11::string::~string((string *)&ctx);
          if ((char)tag_size_str._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&result);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&ctx,(internal *)&tag_size_str,
                       (AssertionResult *)"t->GetBytes(&msg, \"msg\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x38d,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__7,(Message *)&result);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
            std::__cxx11::string::~string((string *)&ctx);
            if (result._0_8_ != 0) {
              (**(code **)(*(long *)result._0_8_ + 8))();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tag_size_str._M_string_length);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ctx,"tag",(allocator<char> *)&result);
            bVar3 = FileTest::GetBytes(t,&tag,(string *)&ctx);
            tag_size_str._M_dataplus._M_p._0_1_ = bVar3;
            tag_size_str._M_string_length = 0;
            std::__cxx11::string::~string((string *)&ctx);
            if ((char)tag_size_str._M_dataplus._M_p != '\0') {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&tag_size_str._M_string_length);
              tag_size_str._M_dataplus._M_p = (pointer)&tag_size_str.field_2;
              tag_size_str._M_string_length = 0;
              tag_size_str.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&ctx,"tagSize",(allocator<char> *)&gtest_ar__7);
              bVar3 = FileTest::GetInstruction(t,&tag_size_str,(string *)&ctx);
              this_00 = (evp_aead_ctx_st_state *)&result.flags;
              result.raw_result._0_1_ = bVar3;
              result.flags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::__cxx11::string::~string((string *)&ctx);
              if ((undefined1)result.raw_result == kValid) {
                testing::Message::Message((Message *)&gtest_ar__7);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ctx,(internal *)&result,
                           (AssertionResult *)"t->GetInstruction(&tag_size_str, \"tagSize\")",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&ct_and_tag,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                           ,0x390,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&ct_and_tag,(Message *)&gtest_ar__7);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ct_and_tag);
                std::__cxx11::string::~string((string *)&ctx);
                if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
                }
LAB_0020efad:
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&this_00->alignment);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&this_00->alignment);
                uVar4 = atoi(tag_size_str._M_dataplus._M_p);
                gtest_ar__7.success_ = false;
                gtest_ar__7._1_3_ = 0;
                result._0_8_ = ZEXT48(uVar4 & 7);
                testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                          ((internal *)&ctx,"0u","tag_size % 8",(uint *)&gtest_ar__7,
                           (unsigned_long *)&result);
                if ((char)ctx.ctx_.aead == '\0') {
                  testing::Message::Message((Message *)&result);
                  if (ctx.ctx_.state.alignment == 0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)ctx.ctx_.state.alignment;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                             ,0x392,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__7,(Message *)&result);
                  this_00 = &ctx.ctx_.state;
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
                  if (result._0_8_ != 0) {
                    (**(code **)(*(long *)result._0_8_ + 8))();
                  }
                  goto LAB_0020efad;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&ctx.ctx_.state.alignment);
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar3 = GetWycheproofResult(t,&result);
                gtest_ar__7.success_ = bVar3;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (bVar3) {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__7.message_);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&ct_and_tag,&ct);
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ct_and_tag,
                             (const_iterator)
                             ct_and_tag.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  EVP_AEAD_CTX_zero(&ctx.ctx_);
                  pcVar6 = (char *)0x0;
                  iVar5 = EVP_AEAD_CTX_init(&ctx.ctx_,aead,
                                            key.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)key.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)key.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                            (ulong)(long)(int)uVar4 >> 3,(ENGINE *)0x0);
                  this = &out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = iVar5 != 0;
                  if (iVar5 == 0) {
                    testing::Message::Message((Message *)&gtest_ar__9);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__7,(internal *)&out,
                               (AssertionResult *)
                               "EVP_AEAD_CTX_init(ctx.get(), aead, key.data(), key.size(), tag_size, nullptr)"
                               ,"false","true",pcVar6);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_3d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                               ,0x39c,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_3d8,(Message *)&gtest_ar__9);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
                    std::__cxx11::string::~string((string *)&gtest_ar__7);
                    if (gtest_ar__9._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar__9._0_8_ + 8))();
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)this);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)this);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&out,(long)msg.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)msg.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                               (allocator_type *)&gtest_ar__7);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&gtest_ar__7,"SmallIv",(allocator<char> *)&local_3d8);
                    __l._M_len = 1;
                    __l._M_array = (iterator)&gtest_ar__7;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&gtest_ar__9,__l,(allocator_type *)&local_3e0);
                    bVar3 = WycheproofResult::IsValid
                                      (&result,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&gtest_ar__9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar__9);
                    std::__cxx11::string::~string((string *)&gtest_ar__7);
                    if (bVar3) {
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_open(&ctx.ctx_,
                                                (uint8_t *)
                                                CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,
                                                ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar__9.success_ = iVar5 != 0;
                      if (iVar5 == 0) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), ct_and_tag.data(), ct_and_tag.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3a6,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                        goto LAB_0020f866;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__9.message_);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )((long)msg.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)msg.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9._0_8_ =
                           msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                      local_3d8.span_.data_ =
                           (uchar *)CONCAT71(out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      local_3d8.span_.size_ = out_len;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)&gtest_ar__7,"Bytes(msg)","Bytes(out.data(), out_len)",
                                 (Bytes *)&gtest_ar__9,&local_3d8);
                      if (gtest_ar__7.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar__9);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar__7.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar6 = "";
                        }
                        else {
                          pcVar6 = *(char **)gtest_ar__7.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_3d8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3a7,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_3d8,(Message *)&gtest_ar__9);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
                        if (gtest_ar__9._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar__9._0_8_ + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__7.message_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                (&out,&ct_and_tag);
                      puVar1 = (uint8_t *)
                               CONCAT71(out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_open(&ctx.ctx_,puVar1,&out_len,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar1,
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,puVar1,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar1,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar__9.success_ = iVar5 != 0;
                      if (iVar5 == 0) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), out.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3ad,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                        goto LAB_0020f866;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__9.message_);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )((long)msg.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)msg.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9._0_8_ =
                           msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                      local_3d8.span_.data_ =
                           (uchar *)CONCAT71(out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      local_3d8.span_.size_ = out_len;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)&gtest_ar__7,"Bytes(msg)","Bytes(out.data(), out_len)",
                                 (Bytes *)&gtest_ar__9,&local_3d8);
                      if (gtest_ar__7.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar__9);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar__7.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar6 = "";
                        }
                        else {
                          pcVar6 = *(char **)gtest_ar__7.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_3d8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3ae,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_3d8,(Message *)&gtest_ar__9);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
                        if (gtest_ar__9._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar__9._0_8_ + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__7.message_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&out,(long)ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_seal(&ctx.ctx_,
                                                (uint8_t *)
                                                CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,
                                                msg.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar__9.success_ = iVar5 != 0;
                      if (iVar5 == 0) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), msg.data(), msg.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3b4,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                        goto LAB_0020f866;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__9.message_);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )((long)ct_and_tag.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ct_and_tag.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9._0_8_ =
                           ct_and_tag.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_3d8.span_.data_ =
                           (uchar *)CONCAT71(out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      local_3d8.span_.size_ = out_len;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)&gtest_ar__7,"Bytes(ct_and_tag)",
                                 "Bytes(out.data(), out_len)",(Bytes *)&gtest_ar__9,&local_3d8);
                      if (gtest_ar__7.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar__9);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar__7.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar6 = "";
                        }
                        else {
                          pcVar6 = *(char **)gtest_ar__7.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_3d8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3b5,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_3d8,(Message *)&gtest_ar__9);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
                        if (gtest_ar__9._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar__9._0_8_ + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__7.message_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                (&out,&msg);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&out,(long)ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                      puVar1 = (uint8_t *)
                               CONCAT71(out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_seal(&ctx.ctx_,puVar1,&out_len,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar1,
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,puVar1,
                                                (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar__9.success_ = iVar5 != 0;
                      if (iVar5 == 0) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), msg.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3bc,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                        goto LAB_0020f866;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__9.message_);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )((long)ct_and_tag.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ct_and_tag.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9._0_8_ =
                           ct_and_tag.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_3d8.span_.data_ =
                           (uchar *)CONCAT71(out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             out.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      local_3d8.span_.size_ = out_len;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)&gtest_ar__7,"Bytes(ct_and_tag)",
                                 "Bytes(out.data(), out_len)",(Bytes *)&gtest_ar__9,&local_3d8);
                      if (gtest_ar__7.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar__9);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar__7.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar6 = "";
                        }
                        else {
                          pcVar6 = *(char **)gtest_ar__7.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_3d8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3bd,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_3d8,(Message *)&gtest_ar__9);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
                        if (gtest_ar__9._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar__9._0_8_ + 8))();
                        }
                      }
                      pAVar2 = &gtest_ar__7;
                    }
                    else {
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_open(&ctx.ctx_,
                                                (uint8_t *)
                                                CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,
                                                ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      bVar3 = iVar5 == 0;
                      gtest_ar__9.success_ = bVar3;
                      if (!bVar3) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), ct_and_tag.data(), ct_and_tag.size(), aad.data(), aad.size())"
                                   ,"true","false",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3c2,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar__9.message_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                (&out,&ct_and_tag);
                      puVar1 = (uint8_t *)
                               CONCAT71(out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar5 = EVP_AEAD_CTX_open(&ctx.ctx_,puVar1,&out_len,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar1,
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,puVar1,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar1,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      gtest_ar__9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar__9.success_ = iVar5 == 0;
                      if (iVar5 != 0) {
                        testing::Message::Message((Message *)&local_3d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), out.size(), aad.data(), aad.size())"
                                   ,"true","false",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3e0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3c8,(char *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_));
                        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3d8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                        std::__cxx11::string::~string((string *)&gtest_ar__7);
                        if ((long *)local_3d8.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d8.span_.data_ + 8))();
                        }
                      }
LAB_0020f866:
                      pAVar2 = &gtest_ar__9;
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&pAVar2->message_);
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              (&out.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                  }
                  bssl::internal::
                  StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
                  ~StackAllocated(&ctx);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            (&ct_and_tag.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                }
                else {
                  testing::Message::Message((Message *)&ct_and_tag);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&ctx,(internal *)&gtest_ar__7,
                             (AssertionResult *)"GetWycheproofResult(t, &result)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&out,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                             ,0x395,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&out,(Message *)&ct_and_tag);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&out);
                  std::__cxx11::string::~string((string *)&ctx);
                  if (ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    (**(code **)(*(long *)ct_and_tag.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 8))();
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__7.message_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&result.flags);
              }
              std::__cxx11::string::~string((string *)&tag_size_str);
              goto LAB_0020eda9;
            }
            testing::Message::Message((Message *)&result);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&ctx,(internal *)&tag_size_str,
                       (AssertionResult *)"t->GetBytes(&tag, \"tag\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x38e,(char *)CONCAT71(ctx.ctx_.aead._1_7_,(char)ctx.ctx_.aead));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__7,(Message *)&result);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
            std::__cxx11::string::~string((string *)&ctx);
            if (result._0_8_ != 0) {
              (**(code **)(*(long *)result._0_8_ + 8))();
            }
          }
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tag_size_str._M_string_length);
LAB_0020eda9:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void RunWycheproofTestCase(FileTest *t, const EVP_AEAD *aead) {
  t->IgnoreInstruction("ivSize");

  std::vector<uint8_t> aad, ct, iv, key, msg, tag;
  ASSERT_TRUE(t->GetBytes(&aad, "aad"));
  ASSERT_TRUE(t->GetBytes(&ct, "ct"));
  ASSERT_TRUE(t->GetBytes(&iv, "iv"));
  ASSERT_TRUE(t->GetBytes(&key, "key"));
  ASSERT_TRUE(t->GetBytes(&msg, "msg"));
  ASSERT_TRUE(t->GetBytes(&tag, "tag"));
  std::string tag_size_str;
  ASSERT_TRUE(t->GetInstruction(&tag_size_str, "tagSize"));
  size_t tag_size = static_cast<size_t>(atoi(tag_size_str.c_str()));
  ASSERT_EQ(0u, tag_size % 8);
  tag_size /= 8;
  WycheproofResult result;
  ASSERT_TRUE(GetWycheproofResult(t, &result));

  std::vector<uint8_t> ct_and_tag = ct;
  ct_and_tag.insert(ct_and_tag.end(), tag.begin(), tag.end());

  bssl::ScopedEVP_AEAD_CTX ctx;
  ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead, key.data(), key.size(),
                                tag_size, nullptr));
  std::vector<uint8_t> out(msg.size());
  size_t out_len;
  // Wycheproof tags small AES-GCM IVs as "acceptable" and otherwise does not
  // use it in AEADs. Any AES-GCM IV that isn't 96 bits is absurd, but our API
  // supports those, so we treat SmallIv tests as valid.
  if (result.IsValid({"SmallIv"})) {
    // Decryption should succeed.
    ASSERT_TRUE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), ct_and_tag.data(),
                                  ct_and_tag.size(), aad.data(), aad.size()));
    EXPECT_EQ(Bytes(msg), Bytes(out.data(), out_len));

    // Decryption in-place should succeed.
    out = ct_and_tag;
    ASSERT_TRUE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), out.data(), out.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(msg), Bytes(out.data(), out_len));

    // AEADs are deterministic, so encryption should produce the same result.
    out.resize(ct_and_tag.size());
    ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), msg.data(), msg.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(ct_and_tag), Bytes(out.data(), out_len));

    // Encrypt in-place.
    out = msg;
    out.resize(ct_and_tag.size());
    ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), out.data(), msg.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(ct_and_tag), Bytes(out.data(), out_len));
  } else {
    // Decryption should fail.
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                   iv.data(), iv.size(), ct_and_tag.data(),
                                   ct_and_tag.size(), aad.data(), aad.size()));

    // Decryption in-place should also fail.
    out = ct_and_tag;
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                   iv.data(), iv.size(), out.data(), out.size(),
                                   aad.data(), aad.size()));
  }
}